

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsPacket.cpp
# Opt level: O1

int __thiscall
MPLSParser::composePip_metadata
          (MPLSParser *this,uint8_t *buffer,int bufferSize,
          vector<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>,_std::allocator<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>_>_>
          *pmtIndexList)

{
  int iVar1;
  PipCorner PVar2;
  value_type *pvVar3;
  pointer pmVar4;
  uint *puVar5;
  uint *puVar6;
  bool bVar7;
  uint32_t uVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  uint value;
  MPLSStreamInfo *si;
  value_type *__x;
  uint uVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  float fVar16;
  float fVar17;
  BitStreamWriter writer;
  vector<MPLSStreamInfo,_std::allocator<MPLSStreamInfo>_> pipStreams;
  vector<unsigned_int_*,_std::allocator<unsigned_int_*>_> blockDataAddressPos;
  uint local_d0;
  BitStreamWriter local_c8;
  vector<MPLSStreamInfo,_std::allocator<MPLSStreamInfo>_> local_a8;
  vector<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>,_std::allocator<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>_>_>
  *local_88;
  ulong local_80;
  ulong local_78;
  ulong local_70;
  void *local_68;
  undefined8 uStack_60;
  long local_58;
  uint32_t *local_50;
  MPLSParser *local_48;
  long local_40;
  uint *local_38;
  
  local_c8.super_BitStream.m_totalBits = 0;
  local_c8.super_BitStream.m_buffer = (uint *)0x0;
  local_c8.super_BitStream.m_initBuffer = (uint *)0x0;
  local_c8.m_curVal = 0;
  local_c8.m_bitWrited = 0;
  local_88 = pmtIndexList;
  BitStream::setBuffer(&local_c8.super_BitStream,buffer,buffer + bufferSize);
  local_c8.m_curVal = 0;
  local_c8.m_bitWrited = 0;
  BitStreamWriter::putBits(&local_c8,0x20,0);
  local_78 = 0;
  local_a8.super__Vector_base<MPLSStreamInfo,_std::allocator<MPLSStreamInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8.super__Vector_base<MPLSStreamInfo,_std::allocator<MPLSStreamInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.super__Vector_base<MPLSStreamInfo,_std::allocator<MPLSStreamInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  __x = (this->m_streamInfo).super__Vector_base<MPLSStreamInfo,_std::allocator<MPLSStreamInfo>_>.
        _M_impl.super__Vector_impl_data._M_start;
  pvVar3 = (this->m_streamInfo).super__Vector_base<MPLSStreamInfo,_std::allocator<MPLSStreamInfo>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_d0 = 0;
  local_48 = this;
  if (__x != pvVar3) {
    local_d0 = 0;
    local_78 = 0;
    do {
      bVar7 = isVideoStreamType((__x->super_M2TSStreamInfo).stream_coding_type);
      if (bVar7) {
        if ((__x->super_M2TSStreamInfo).isSecondary == true) {
          std::vector<MPLSStreamInfo,_std::allocator<MPLSStreamInfo>_>::push_back(&local_a8,__x);
        }
        else {
          local_78 = (ulong)(__x->super_M2TSStreamInfo).width;
          local_d0 = (__x->super_M2TSStreamInfo).height;
        }
      }
      __x = __x + 1;
    } while (__x != pvVar3);
  }
  local_80 = ((long)local_a8.super__Vector_base<MPLSStreamInfo,_std::allocator<MPLSStreamInfo>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)local_a8.super__Vector_base<MPLSStreamInfo,_std::allocator<MPLSStreamInfo>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 4) * 0x6db6db6db6db6db7;
  uVar12 = (int)((ulong)((long)(local_88->
                               super__Vector_base<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>,_std::allocator<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_finish -
                        (long)(local_88->
                              super__Vector_base<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>,_std::allocator<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x55555555;
  local_50 = (uint32_t *)buffer;
  BitStreamWriter::putBits(&local_c8,0x10,uVar12 * (int)local_80);
  local_68 = (void *)0x0;
  uStack_60 = 0;
  local_58 = 0;
  if (uVar12 != 0) {
    uVar14 = local_80 & 0xffffffff;
    uVar11 = 0;
    do {
      if ((uint)local_80 != 0) {
        lVar13 = 0x68;
        uVar15 = 0;
        do {
          uVar10 = *(uint *)(((local_a8.
                               super__Vector_base<MPLSStreamInfo,_std::allocator<MPLSStreamInfo>_>.
                               _M_impl.super__Vector_impl_data._M_start)->super_M2TSStreamInfo).
                             language_code + lVar13 + -0x20);
          BitStreamWriter::putBits(&local_c8,0x10,uVar11);
          BitStreamWriter::putBits(&local_c8,8,(uint)uVar15);
          BitStreamWriter::putBits(&local_c8,8,0);
          BitStreamWriter::putBits(&local_c8,4,~uVar10 >> 0x1f);
          BitStreamWriter::putBits(&local_c8,1,1);
          BitStreamWriter::putBits(&local_c8,1,1);
          BitStreamWriter::putBits(&local_c8,10,0);
          BitStreamWriter::putBits(&local_c8,8,0);
          if ((int)uVar10 < 0) {
            uVar10 = 0;
          }
          BitStreamWriter::putBits(&local_c8,8,uVar10);
          BitStreamWriter::putBits(&local_c8,0x10,0);
          iVar9 = (int)local_c8.super_BitStream.m_buffer -
                  (int)local_c8.super_BitStream.m_initBuffer;
          iVar1 = local_c8.m_bitWrited + iVar9 * 8;
          iVar9 = local_c8.m_bitWrited + iVar9 * 8 + 7;
          if (-1 < iVar1) {
            iVar9 = iVar1;
          }
          local_38 = (uint *)((long)(iVar9 >> 3) + (long)local_c8.super_BitStream.m_initBuffer);
          std::vector<unsigned_int*,std::allocator<unsigned_int*>>::emplace_back<unsigned_int*>
                    ((vector<unsigned_int*,std::allocator<unsigned_int*>> *)&local_68,&local_38);
          BitStreamWriter::putBits(&local_c8,0x20,0);
          uVar15 = uVar15 + 1;
          lVar13 = lVar13 + 0x70;
        } while (uVar14 != uVar15);
      }
      uVar11 = uVar11 + 1;
    } while (uVar11 != uVar12);
  }
  while( true ) {
    if ((((int)local_c8.super_BitStream.m_buffer - (int)local_c8.super_BitStream.m_initBuffer) * 8 +
         local_c8.m_bitWrited & 0xf) == 0) break;
    BitStreamWriter::putBits(&local_c8,1,0);
  }
  if ((local_88->
      super__Vector_base<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>,_std::allocator<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish !=
      (local_88->
      super__Vector_base<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>,_std::allocator<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start) {
    uVar14 = 0;
    do {
      local_70 = uVar14;
      if (local_a8.super__Vector_base<MPLSStreamInfo,_std::allocator<MPLSStreamInfo>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          local_a8.super__Vector_base<MPLSStreamInfo,_std::allocator<MPLSStreamInfo>_>._M_impl.
          super__Vector_impl_data._M_start) {
        local_40 = uVar14 * 0x6db6db6db6db6db8;
        uVar14 = 0;
        do {
          uVar12 = local_a8.super__Vector_base<MPLSStreamInfo,_std::allocator<MPLSStreamInfo>_>.
                   _M_impl.super__Vector_impl_data._M_start[uVar14].pipParams.scaleIndex;
          PVar2 = local_a8.super__Vector_base<MPLSStreamInfo,_std::allocator<MPLSStreamInfo>_>.
                  _M_impl.super__Vector_impl_data._M_start[uVar14].pipParams.corner;
          local_80 = CONCAT44(local_80._4_4_,
                              local_a8.
                              super__Vector_base<MPLSStreamInfo,_std::allocator<MPLSStreamInfo>_>.
                              _M_impl.super__Vector_impl_data._M_start[uVar14].pipParams.hOffset);
          uVar11 = local_a8.super__Vector_base<MPLSStreamInfo,_std::allocator<MPLSStreamInfo>_>.
                   _M_impl.super__Vector_impl_data._M_start[uVar14].pipParams.vOffset;
          iVar1 = local_c8.m_bitWrited +
                  ((int)local_c8.super_BitStream.m_buffer -
                  (int)local_c8.super_BitStream.m_initBuffer) * 8;
          iVar9 = local_c8.m_bitWrited +
                  ((int)local_c8.super_BitStream.m_buffer -
                  (int)local_c8.super_BitStream.m_initBuffer) * 8 + 7;
          if (-1 < iVar1) {
            iVar9 = iVar1;
          }
          uVar8 = my_ntohl(iVar9 >> 3);
          **(uint32_t **)
            ((long)local_68 +
            uVar14 * 8 +
            ((long)local_a8.super__Vector_base<MPLSStreamInfo,_std::allocator<MPLSStreamInfo>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)local_a8.super__Vector_base<MPLSStreamInfo,_std::allocator<MPLSStreamInfo>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 4) * local_40) = uVar8;
          BitStreamWriter::putBits(&local_c8,0x10,1);
          if (local_70 == 0) {
LAB_001e59ee:
            BitStreamWriter::putBits(&local_c8,0x20,local_48->IN_time);
          }
          else {
            pmVar4 = (local_88->
                     super__Vector_base<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>,_std::allocator<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            if (*(size_t *)((long)&pmVar4[local_70 - 1]._M_t._M_impl.super__Rb_tree_header + 0x20)
                == 0) goto LAB_001e59ee;
            BitStreamWriter::putBits
                      (&local_c8,0x20,
                       (uint)(*(ulong *)(*(_Base_ptr *)
                                          ((long)&pmVar4[local_70]._M_t._M_impl.
                                                  super__Rb_tree_header + 0x10) + 1) >> 1));
          }
          uVar10 = 0;
          value = 0;
          if (uVar12 != 5) {
            uVar10 = uVar12 - 2;
            fVar17 = 1.0;
            if (uVar10 < 3) {
              fVar17 = *(float *)(&DAT_0020f310 + (ulong)uVar10 * 4);
            }
            fVar16 = 1.0;
            if (uVar10 < 3) {
              fVar16 = *(float *)(&DAT_0020f310 + (ulong)uVar10 * 4);
            }
            uVar10 = (uint)local_80;
            if (PVar2 - TopRight < 2) {
              uVar10 = (int)local_78 -
                       ((uint)local_80 +
                       (int)(fVar17 * (float)local_a8.
                                             super__Vector_base<MPLSStreamInfo,_std::allocator<MPLSStreamInfo>_>
                                             ._M_impl.super__Vector_impl_data._M_start[uVar14].
                                             super_M2TSStreamInfo.width));
            }
            value = local_d0 -
                    ((int)(fVar16 * (float)local_a8.
                                           super__Vector_base<MPLSStreamInfo,_std::allocator<MPLSStreamInfo>_>
                                           ._M_impl.super__Vector_impl_data._M_start[uVar14].
                                           super_M2TSStreamInfo.height) + uVar11);
            if ((PVar2 & ~TopRight) != BottomRight) {
              value = uVar11;
            }
          }
          BitStreamWriter::putBits(&local_c8,0xc,uVar10);
          BitStreamWriter::putBits(&local_c8,0xc,value);
          BitStreamWriter::putBits(&local_c8,4,uVar12);
          BitStreamWriter::putBits(&local_c8,4,0);
          while( true ) {
            if ((((int)local_c8.super_BitStream.m_buffer -
                 (int)local_c8.super_BitStream.m_initBuffer) * 8 + local_c8.m_bitWrited & 0xf) == 0)
            break;
            BitStreamWriter::putBits(&local_c8,1,0);
          }
          uVar14 = uVar14 + 1;
        } while (uVar14 < (ulong)(((long)local_a8.
                                         super__Vector_base<MPLSStreamInfo,_std::allocator<MPLSStreamInfo>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_a8.
                                         super__Vector_base<MPLSStreamInfo,_std::allocator<MPLSStreamInfo>_>
                                         ._M_impl.super__Vector_impl_data._M_start >> 4) *
                                 0x6db6db6db6db6db7));
      }
      uVar14 = local_70 + 1;
    } while (uVar14 < (ulong)(((long)(local_88->
                                     super__Vector_base<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>,_std::allocator<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>_>_>
                                     )._M_impl.super__Vector_impl_data._M_finish -
                               (long)(local_88->
                                     super__Vector_base<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>,_std::allocator<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>_>_>
                                     )._M_impl.super__Vector_impl_data._M_start >> 4) *
                             -0x5555555555555555));
  }
  BitStreamWriter::flushBits(&local_c8);
  iVar1 = local_c8.m_bitWrited +
          ((int)local_c8.super_BitStream.m_buffer - (int)local_c8.super_BitStream.m_initBuffer) * 8;
  iVar9 = local_c8.m_bitWrited +
          ((int)local_c8.super_BitStream.m_buffer - (int)local_c8.super_BitStream.m_initBuffer) * 8
          + 7;
  if (-1 < iVar1) {
    iVar9 = iVar1;
  }
  uVar8 = my_ntohl((iVar9 >> 3) - 4);
  puVar6 = local_c8.super_BitStream.m_initBuffer;
  puVar5 = local_c8.super_BitStream.m_buffer;
  *local_50 = uVar8;
  uVar12 = local_c8.m_bitWrited;
  if (local_68 != (void *)0x0) {
    operator_delete(local_68,local_58 - (long)local_68);
  }
  iVar9 = (int)puVar5 - (int)puVar6;
  iVar1 = uVar12 + iVar9 * 8;
  iVar9 = uVar12 + iVar9 * 8 + 7;
  if (-1 < iVar1) {
    iVar9 = iVar1;
  }
  std::vector<MPLSStreamInfo,_std::allocator<MPLSStreamInfo>_>::~vector(&local_a8);
  return iVar9 >> 3;
}

Assistant:

int MPLSParser::composePip_metadata(uint8_t* buffer, const int bufferSize,
                                    const std::vector<PMTIndex>& pmtIndexList) const
{
    // The ID1 value and the ID2 value of the ExtensionData() shall be set to 0x0001 and 0x0001
    BitStreamWriter writer{};
    writer.setBuffer(buffer, buffer + bufferSize);
    const auto lengthPos = reinterpret_cast<uint32_t*>(buffer);
    writer.putBits(32, 0);  // length

    vector<MPLSStreamInfo> pipStreams;
    unsigned mainVSize = 0, mainHSize = 0;
    for (auto& si : m_streamInfo)
    {
        const StreamType stream_coding_type = si.stream_coding_type;
        if (isVideoStreamType(stream_coding_type))
        {
            if (si.isSecondary)
            {
                pipStreams.push_back(si);
            }
            else
            {
                mainHSize = si.width;
                mainVSize = si.height;
            }
        }
    }

    const auto pipStreamsSize = static_cast<unsigned>(pipStreams.size());
    const auto pmtIndexListSize = static_cast<unsigned>(pmtIndexList.size());

    writer.putBits(16, pipStreamsSize * pmtIndexListSize);
    vector<uint32_t*> blockDataAddressPos;
    for (unsigned i = 0; i < pmtIndexListSize; ++i)
    {
        for (unsigned k = 0; k < pipStreamsSize; k++)
        {
            const PIPParams pipParams = pipStreams[k].pipParams;
            // metadata_block_header[k]() {
            writer.putBits(16, i);  // ref_to_PlayItem_id
            writer.putBits(8, k);   // ref_to_secondary_video_stream_id
            writer.putBits(8, 0);   // reserved_for_future_use
            // pip_timeline_type == 1. Synchronous type of Picture-in-Picture
            writer.putBits(4, pipParams.lumma >= 0 ? 1 : 0);
            writer.putBit(1);       // is_luma_key = 0
            writer.putBit(1);       // trick_playing_flag. keep PIP windows when tricking
            writer.putBits(10, 0);  // reserved_for_word_align
            writer.putBits(8, 0);   // reserved_for_future_use
            if (pipParams.lumma >= 0)
            {                                        // is_luma_key==1b
                writer.putBits(8, pipParams.lumma);  // transparent Y pixels
            }
            else
            {
                writer.putBits(8, 0);  // reserved_for_future_use
            }
            writer.putBits(16, 0);  // reserved_for_future_use
            blockDataAddressPos.push_back(reinterpret_cast<uint32_t*>(writer.getBuffer() + writer.getBitsCount() / 8));
            writer.putBits(32, 0);  // metadata_block_data_start_address
        }
    }
    while (writer.getBitsCount() % 16 != 0) writer.putBit(0);
    for (size_t i = 0; i < pmtIndexList.size(); ++i)
    {
        for (size_t k = 0; k < pipStreams.size(); ++k)
        {
            PIPParams pipParams = pipStreams[k].pipParams;

            *(blockDataAddressPos[i * pipStreams.size() + k]) = my_htonl(writer.getBitsCount() / 8);

            writer.putBits(16, 1);  // number_of_pip_metadata_entries
            {
                if (i != 0 && !pmtIndexList[i - 1].empty())
                    writer.putBits(32, static_cast<unsigned>(pmtIndexList[i].begin()->first / 2));
                else
                    writer.putBits(32, IN_time);

                unsigned hPos = 0;
                unsigned vPos = 0;

                if (!pipParams.isFullScreen())
                {
                    hPos = pipParams.hOffset;
                    vPos = pipParams.vOffset;

                    const int pipWidth =
                        static_cast<int>(static_cast<float>(pipStreams[k].width) * pipParams.getScaleCoeff());
                    const int pipHeight =
                        static_cast<int>(static_cast<float>(pipStreams[k].height) * pipParams.getScaleCoeff());

                    if (pipParams.corner == PIPParams::PipCorner::TopRight ||
                        pipParams.corner == PIPParams::PipCorner::BottomRight)
                        hPos = mainHSize - pipWidth - pipParams.hOffset;
                    if (pipParams.corner == PIPParams::PipCorner::BottomRight ||
                        pipParams.corner == PIPParams::PipCorner::BottomLeft)
                        vPos = mainVSize - pipHeight - pipParams.vOffset;
                }

                writer.putBits(12, hPos);
                writer.putBits(12, vPos);

                writer.putBits(4, pipParams.scaleIndex);  // pip_scale[i]. 1 == no_scale
                writer.putBits(4, 0);                     // reserved_for_future_use
            }
            while (writer.getBitsCount() % 16 != 0) writer.putBit(0);
        }
    }

    writer.flushBits();
    *lengthPos = my_htonl(writer.getBitsCount() / 8 - 4);
    return writer.getBitsCount() / 8;
}